

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg-ndfs.cc
# Opt level: O0

void __thiscall
tchecker::tck_liveness::zg_ndfs::graph_t::graph_t
          (graph_t *this,shared_ptr<tchecker::zg::zg_t> *zg,size_t block_size,size_t table_size)

{
  node_equal_to_t local_2a;
  node_hash_t local_29;
  size_t local_28;
  size_t table_size_local;
  size_t block_size_local;
  shared_ptr<tchecker::zg::zg_t> *zg_local;
  graph_t *this_local;
  
  local_28 = table_size;
  table_size_local = block_size;
  block_size_local = (size_t)zg;
  zg_local = (shared_ptr<tchecker::zg::zg_t> *)this;
  tchecker::graph::reachability::
  graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
  ::graph_t(&this->
             super_graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
            ,block_size,table_size,&local_29,&local_2a);
  (this->
  super_graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
  )._vptr_graph_t = (_func_int **)&PTR__graph_t_004218c8;
  std::shared_ptr<tchecker::zg::zg_t>::shared_ptr
            (&this->_zg,(shared_ptr<tchecker::zg::zg_t> *)block_size_local);
  return;
}

Assistant:

graph_t::graph_t(std::shared_ptr<tchecker::zg::zg_t> const & zg, std::size_t block_size, std::size_t table_size)
    : tchecker::graph::reachability::graph_t<tchecker::tck_liveness::zg_ndfs::node_t, tchecker::tck_liveness::zg_ndfs::edge_t,
                                             tchecker::tck_liveness::zg_ndfs::node_hash_t,
                                             tchecker::tck_liveness::zg_ndfs::node_equal_to_t>(
          block_size, table_size, tchecker::tck_liveness::zg_ndfs::node_hash_t(),
          tchecker::tck_liveness::zg_ndfs::node_equal_to_t()),
      _zg(zg)
{
}